

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
ImmediatePromiseNode<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>::
destroy(ImmediatePromiseNode<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>
        *this)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  
  if ((((this->result).value.ptr.isSet == true) &&
      ((this->result).value.ptr.field_1.value.ptr.isSet == true)) &&
     (lVar1 = *(long *)((long)&(this->result).value.ptr.field_1 + 8), lVar1 != 0)) {
    uVar2 = *(undefined8 *)((long)&(this->result).value.ptr.field_1 + 0x10);
    *(undefined8 *)((long)&(this->result).value.ptr.field_1 + 8) = 0;
    *(undefined8 *)((long)&(this->result).value.ptr.field_1 + 0x10) = 0;
    puVar3 = *(undefined8 **)((long)&(this->result).value.ptr.field_1 + 0x18);
    (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0);
  }
  if ((this->result).super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&(this->result).super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  ImmediatePromiseNodeBase::~ImmediatePromiseNodeBase(&this->super_ImmediatePromiseNodeBase);
  return;
}

Assistant:

void destroy() override { freePromise(this); }